

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void alloc_hist_array(void)

{
  char *__ptr;
  int iVar1;
  message *__ptr_00;
  wchar_t wVar2;
  wchar_t wVar3;
  message *pmVar4;
  long lVar5;
  wchar_t wVar6;
  size_t __nmemb;
  wchar_t wVar7;
  
  wVar7 = histpos;
  wVar2 = histsize;
  __ptr_00 = msghistory;
  iVar1 = settings.msghistory;
  __nmemb = (size_t)settings.msghistory;
  pmVar4 = (message *)calloc(__nmemb,0x10);
  histsize = iVar1;
  histpos = L'\xffffffff';
  msghistory = pmVar4;
  if (0 < (long)__nmemb) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&pmVar4->turn + lVar5) = 0;
      *(undefined8 *)((long)&pmVar4->msg + lVar5) = 0;
      lVar5 = lVar5 + 0x10;
    } while (__nmemb * 0x10 != lVar5);
  }
  if (__ptr_00 != (message *)0x0) {
    if (L'\0' < wVar2) {
      wVar6 = wVar2;
      do {
        wVar7 = wVar7 + L'\x01';
        wVar3 = wVar2;
        if (wVar7 < wVar2) {
          wVar3 = L'\0';
        }
        if (__ptr_00[wVar7 - wVar3].turn != L'\0') {
          store_message(__ptr_00[wVar7 - wVar3].turn,__ptr_00[wVar7 - wVar3].msg);
        }
        __ptr = __ptr_00[wVar7 - wVar3].msg;
        if (__ptr != (char *)0x0) {
          free(__ptr);
        }
        wVar6 = wVar6 + L'\xffffffff';
      } while (wVar6 != L'\0');
    }
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void alloc_hist_array(void)
{
    struct message *oldhistory = msghistory;
    int i, oldsize = histsize, oldpos = histpos;
    
    msghistory = calloc(settings.msghistory, sizeof(struct message));
    histsize = settings.msghistory;
    histpos = -1; /* histpos is incremented before any message is stored */
    for (i = 0; i < histsize; i++) {
	msghistory[i].turn = 0;
	msghistory[i].msg = NULL;
    }

    if (!oldhistory)
	return;
    
    for (i = 0; i < oldsize; i++) {
	int pos = oldpos + i + 1;
	if (pos >= oldsize) /* wrap around eventually */
	    pos -= oldsize;
	
	if (oldhistory[pos].turn)
	    store_message(oldhistory[pos].turn, oldhistory[pos].msg);
	if (oldhistory[pos].msg)
	    free(oldhistory[pos].msg);
    }
    
    free(oldhistory);
}